

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperRefs.c
# Opt level: O0

float Map_CutRefDeref(Map_Cut_t *pCut,int fPhase,int fReference,int fUpdateProf)

{
  Map_Node_t *pMVar1;
  int iVar2;
  float fVar3;
  uint local_44;
  int local_40;
  int fPhaseChild;
  int i;
  float aArea;
  Map_Cut_t *pCutChild;
  Map_Node_t *pNodeChild;
  int fUpdateProf_local;
  int fReference_local;
  int fPhase_local;
  Map_Cut_t *pCut_local;
  
  if (pCut->nLeaves == '\x01') {
    pCut_local._4_4_ = 0.0;
  }
  else {
    fPhaseChild = (int)Map_CutGetRootArea(pCut,fPhase);
    if (fUpdateProf != 0) {
      if (fReference == 0) {
        Mio_GateDecProfile2((pCut->M[fPhase].pSuperBest)->pRoot);
      }
      else {
        Mio_GateIncProfile2((pCut->M[fPhase].pSuperBest)->pRoot);
      }
    }
    for (local_40 = 0; local_40 < pCut->nLeaves; local_40 = local_40 + 1) {
      pMVar1 = pCut->ppLeaves[local_40];
      local_44 = Map_CutGetLeafPhase(pCut,fPhase,local_40);
      if (fReference == 0) {
        if ((pMVar1->pCutBest[0] == (Map_Cut_t *)0x0) || (pMVar1->pCutBest[1] == (Map_Cut_t *)0x0))
        {
          iVar2 = pMVar1->nRefAct[(int)local_44] + -1;
          pMVar1->nRefAct[(int)local_44] = iVar2;
          if ((iVar2 == 0) && (pMVar1->pCutBest[(int)local_44] == (Map_Cut_t *)0x0)) {
            fPhaseChild = (int)(pMVar1->p->pSuperLib->AreaInv + (float)fPhaseChild);
          }
          iVar2 = pMVar1->nRefAct[2] + -1;
          pMVar1->nRefAct[2] = iVar2;
        }
        else {
          pMVar1->nRefAct[2] = pMVar1->nRefAct[2] + -1;
          iVar2 = pMVar1->nRefAct[(int)local_44] + -1;
          pMVar1->nRefAct[(int)local_44] = iVar2;
        }
        if (iVar2 < 1) {
          if (pMVar1->nRefAct[(int)local_44] < 0) {
            __assert_fail("pNodeChild->nRefAct[fPhaseChild] >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperRefs.c"
                          ,0x133,"float Map_CutRefDeref(Map_Cut_t *, int, int, int)");
          }
          goto LAB_004af47c;
        }
      }
      else {
        if ((pMVar1->pCutBest[0] == (Map_Cut_t *)0x0) || (pMVar1->pCutBest[1] == (Map_Cut_t *)0x0))
        {
          iVar2 = pMVar1->nRefAct[(int)local_44];
          pMVar1->nRefAct[(int)local_44] = iVar2 + 1;
          if ((iVar2 == 0) && (pMVar1->pCutBest[(int)local_44] == (Map_Cut_t *)0x0)) {
            fPhaseChild = (int)(pMVar1->p->pSuperLib->AreaInv + (float)fPhaseChild);
          }
          iVar2 = pMVar1->nRefAct[2];
          pMVar1->nRefAct[2] = iVar2 + 1;
        }
        else {
          pMVar1->nRefAct[2] = pMVar1->nRefAct[2] + 1;
          iVar2 = pMVar1->nRefAct[(int)local_44];
          pMVar1->nRefAct[(int)local_44] = iVar2 + 1;
        }
        if (iVar2 < 1) {
LAB_004af47c:
          _i = pMVar1->pCutBest[(int)local_44];
          if (_i == (Map_Cut_t *)0x0) {
            local_44 = (uint)((local_44 != 0 ^ 0xffU) & 1);
            _i = pMVar1->pCutBest[(int)local_44];
          }
          fVar3 = Map_CutRefDeref(_i,local_44,fReference,fUpdateProf);
          fPhaseChild = (int)(fVar3 + (float)fPhaseChild);
        }
      }
    }
    pCut_local._4_4_ = (float)fPhaseChild;
  }
  return pCut_local._4_4_;
}

Assistant:

float Map_CutRefDeref( Map_Cut_t * pCut, int fPhase, int fReference, int fUpdateProf )
{
    Map_Node_t * pNodeChild;
    Map_Cut_t * pCutChild;
    float aArea;
    int i, fPhaseChild;
//    int nRefs;

    // consider the elementary variable
    if ( pCut->nLeaves == 1 )
        return 0;
    // start the area of this cut
    aArea = Map_CutGetRootArea( pCut, fPhase );
    if ( fUpdateProf )
    {
        if ( fReference )
            Mio_GateIncProfile2( pCut->M[fPhase].pSuperBest->pRoot );
        else
            Mio_GateDecProfile2( pCut->M[fPhase].pSuperBest->pRoot );
    }
    // go through the children
    for ( i = 0; i < pCut->nLeaves; i++ )
    {
        pNodeChild  = pCut->ppLeaves[i];
        fPhaseChild = Map_CutGetLeafPhase( pCut, fPhase, i );
        // get the reference counter of the child
/*
        // this code does not take inverters into account
        // the quality of area recovery seems to always be a little worse
        if ( fReference )
            nRefs = Map_NodeIncRefPhaseAct( pNodeChild, fPhaseChild );
        else
            nRefs = Map_NodeDecRefPhaseAct( pNodeChild, fPhaseChild );
        assert( nRefs >= 0 );
        // skip if the child was already reference before
        if ( nRefs > 0 )
            continue;
*/

        if ( fReference )
        {
            if ( pNodeChild->pCutBest[0] && pNodeChild->pCutBest[1] ) // both phases are present
            {
                // if this phase of the node is referenced, there is no recursive call
                pNodeChild->nRefAct[2]++;
                if ( pNodeChild->nRefAct[fPhaseChild]++ > 0 )
                    continue;
            }
            else // only one phase is present
            {
                // inverter should be added if the phase
                // (a) has no reference and (b) is implemented using other phase
                if ( pNodeChild->nRefAct[fPhaseChild]++ == 0 && pNodeChild->pCutBest[fPhaseChild] == NULL )
                    aArea += pNodeChild->p->pSuperLib->AreaInv;
                // if the node is referenced, there is no recursive call
                if ( pNodeChild->nRefAct[2]++ > 0 )
                    continue;
            }
        }
        else
        {
            if ( pNodeChild->pCutBest[0] && pNodeChild->pCutBest[1] ) // both phases are present
            {
                // if this phase of the node is referenced, there is no recursive call
                --pNodeChild->nRefAct[2];
                if ( --pNodeChild->nRefAct[fPhaseChild] > 0 )
                    continue;
            }
            else // only one phase is present
            {
                // inverter should be added if the phase
                // (a) has no reference and (b) is implemented using other phase
                if ( --pNodeChild->nRefAct[fPhaseChild] == 0 && pNodeChild->pCutBest[fPhaseChild] == NULL )
                    aArea += pNodeChild->p->pSuperLib->AreaInv;
                // if the node is referenced, there is no recursive call
                if ( --pNodeChild->nRefAct[2] > 0 )
                    continue;
            }
            assert( pNodeChild->nRefAct[fPhaseChild] >= 0 );
        }

        // get the child cut
        pCutChild = pNodeChild->pCutBest[fPhaseChild];
        // if the child does not have this phase mapped, take the opposite phase
        if ( pCutChild == NULL )
        {
            fPhaseChild = !fPhaseChild;
            pCutChild   = pNodeChild->pCutBest[fPhaseChild];
        }
        // reference and compute area recursively
        aArea += Map_CutRefDeref( pCutChild, fPhaseChild, fReference, fUpdateProf );
    }
    return aArea;
}